

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeUtils.h
# Opt level: O2

void TimeUtils::addOffset(timeval *t,int msecs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lStack_8;
  
  lVar1 = (long)(msecs / 1000) + t->tv_sec;
  t->tv_sec = lVar1;
  lVar2 = (long)((msecs % 1000) * 1000) + t->tv_usec;
  t->tv_usec = lVar2;
  if (lVar2 < 1000000) {
    if (-1 < lVar2) {
      return;
    }
    lVar3 = 1000000;
    lStack_8 = -1;
  }
  else {
    lVar3 = -1000000;
    lStack_8 = 1;
  }
  t->tv_sec = lVar1 + lStack_8;
  t->tv_usec = lVar2 + lVar3;
  return;
}

Assistant:

inline void addOffset( struct timeval *t, int msecs )
	{
		t->tv_sec += msecs / 1000;
		t->tv_usec += (msecs % 1000) * 1000;

		if (t->tv_usec >= 1000000)
		{
			t->tv_sec++;
			t->tv_usec -= 1000000;
		}
		else if (t->tv_usec < 0)
		{
			t->tv_sec--;
			t->tv_usec += 1000000;
		}
	}